

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int bam_plp_push(bam_plp_t iter,bam1_t *b)

{
  uint32_t *cigar_max;
  undefined1 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  kh_olap_hash_t *h;
  uint8_t *key;
  ulong uVar4;
  uint64_t uVar5;
  khint_t kVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined1 *puVar11;
  lbnode_t *plVar12;
  sbyte sVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  undefined1 uVar17;
  long lVar18;
  uint32_t *cigar_max_00;
  khint32_t *pkVar19;
  uint uVar20;
  char *__ptr;
  lbnode_t *plVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  bool bVar26;
  size_t sStack_b0;
  int b_iref;
  int b_iseq;
  ulong local_80;
  lbnode_t *local_78;
  khint32_t *local_70;
  int a_iref;
  int b_icig;
  int a_iseq;
  lbnode_t *local_58;
  lbnode_t *local_50;
  uint local_48;
  int a_icig;
  uint32_t *b_cigar;
  uint32_t *a_cigar;
  ulong uVar21;
  
  if (iter->error != 0) {
    return -1;
  }
  if (b == (bam1_t *)0x0) {
    iter->is_eof = 1;
    return 0;
  }
  iVar8 = (b->core).tid;
  if (((iVar8 < 0) || (((b->core).field_0xc & 4) != 0)) ||
     ((iter->tid == iVar8 && ((iter->pos == (b->core).pos && (iter->maxcnt < iter->mp->cnt)))))) {
    overlap_remove(iter,b);
    return 0;
  }
  bam_copy1(&iter->tail->b,b);
  h = iter->overlaps;
  if (h == (kh_olap_hash_t *)0x0) goto LAB_00134041;
  plVar12 = iter->tail;
  uVar21 = *(ulong *)&(plVar12->b).core.field_0x8;
  if ((uVar21 & 0xa00000000) != 0x200000000) goto LAB_00134041;
  uVar23 = (plVar12->b).core.l_qseq;
  iVar8 = (plVar12->b).core.isize;
  iVar10 = -iVar8;
  if (0 < iVar8) {
    iVar10 = iVar8;
  }
  if ((int)(uVar23 * 2) <= iVar10) goto LAB_00134041;
  key = (plVar12->b).data;
  local_80 = (ulong)uVar23;
  kVar6 = kh_get_olap_hash(h,(kh_cstr_t)key);
  plVar22 = (lbnode_t *)(ulong)kVar6;
  local_50 = plVar12;
  if (kVar6 != h->n_buckets) {
    local_78 = h->vals[(long)plVar22];
    uVar4 = *(ulong *)&(local_78->b).core.field_0x8;
    a_cigar = (uint32_t *)((local_78->b).data + (uVar4 >> 0x18 & 0xff));
    cigar_max = a_cigar + (uVar4 >> 0x30);
    a_icig = 0;
    a_iseq = 0;
    b_icig = 0;
    b_iseq = 0;
    local_70 = (khint32_t *)CONCAT44(local_70._4_4_,(local_78->b).core.l_qseq);
    iVar8 = (plVar12->b).core.pos;
    a_iref = iVar8 - (local_78->b).core.pos;
    b_iref = 0;
    local_58 = plVar22;
    b_cigar = (uint32_t *)(key + (uVar21 >> 0x18 & 0xff));
    iVar10 = cigar_iref2iseq_set(&a_cigar,cigar_max,&a_icig,&a_iseq,&a_iref);
    if (-1 < iVar10) {
      cigar_max_00 = (uint32_t *)((long)(key + (uVar21 >> 0x18 & 0xff)) + (uVar21 >> 0x30) * 4);
      iVar7 = cigar_iref2iseq_set(&b_cigar,cigar_max_00,&b_icig,&b_iseq,&b_iref);
      if (-1 < iVar7) {
        local_70 = (khint32_t *)((long)((int)local_70 + 1 >> 1) + (long)cigar_max);
        local_80 = (long)((int)local_80 + 1 >> 1) + (long)cigar_max_00;
        plVar12 = local_78;
        while( true ) {
          while ((plVar22 = local_50, iVar7 = a_iref, -1 < a_iref &&
                 (a_iref < iVar8 - (plVar12->b).core.pos))) {
            iVar10 = cigar_iref2iseq_next(&a_cigar,cigar_max,&a_icig,&a_iseq,&a_iref);
          }
          if (iVar10 < 0) break;
          iVar25 = (local_78->b).core.pos + a_iref;
          if (iVar25 < iVar8) {
            iVar25 = iVar8;
          }
          iVar8 = 0;
          while ((-1 < b_iref && (b_iref < iVar25 - (plVar22->b).core.pos))) {
            iVar8 = cigar_iref2iseq_next(&b_cigar,cigar_max_00,&b_icig,&b_iseq,&b_iref);
          }
          if (iVar8 < 0) break;
          iVar15 = b_iref + (local_50->b).core.pos;
          if (iVar25 <= iVar15) {
            iVar25 = iVar15;
          }
          iVar8 = iVar25 + 1;
          plVar12 = local_78;
          if (iVar7 + (local_78->b).core.pos == iVar15) {
            lVar18 = (long)b_iseq;
            puVar1 = (undefined1 *)((long)local_70 + (long)a_iseq);
            bVar14 = *(byte *)((long)local_70 + (long)a_iseq);
            if (((*(byte *)((long)cigar_max_00 + (long)(b_iseq >> 1)) >>
                  (~((char)b_iseq * '\x04') & 4U) ^
                 *(byte *)((long)cigar_max + (long)(a_iseq >> 1)) >> (~((char)a_iseq * '\x04') & 4U)
                 ) & 0xf) == 0) {
              uVar23 = (uint)*(byte *)(local_80 + lVar18) + (uint)bVar14;
              if (199 < uVar23) {
                uVar23 = 200;
              }
              uVar17 = (undefined1)uVar23;
LAB_00133e2e:
              puVar11 = (undefined1 *)(local_80 + lVar18);
              *puVar1 = uVar17;
            }
            else {
              if (*(byte *)(local_80 + lVar18) <= bVar14) {
                uVar17 = (undefined1)(int)((double)bVar14 * 0.8);
                goto LAB_00133e2e;
              }
              *(char *)(local_80 + lVar18) = (char)(int)((double)*(byte *)(local_80 + lVar18) * 0.8)
              ;
              puVar11 = puVar1;
            }
            *puVar11 = 0;
          }
        }
      }
    }
    kh_del_olap_hash(iter->overlaps,(khint_t)local_58);
    plVar12 = local_78;
    if (local_78->end + -1 != (local_78->s).end) {
      __assert_fail("a->end-1 == a->s.end",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                    ,0x66e,"void overlap_push(bam_plp_t, lbnode_t *)");
    }
    iVar8 = (local_78->b).core.pos;
    uVar21 = *(ulong *)&(local_78->b).core.field_0x8;
    iVar10 = bam_cigar2rlen((uint)(ushort)(uVar21 >> 0x30),
                            (uint32_t *)((local_78->b).data + (uVar21 >> 0x18 & 0xff)));
    plVar12->end = iVar10 + iVar8;
    (plVar12->s).end = iVar10 + iVar8 + -1;
    goto LAB_00134041;
  }
  if (h->n_occupied < h->upper_bound) {
LAB_00133eb1:
    uVar23 = (int)plVar22 - 1;
    kVar6 = __ac_X31_hash_string((char *)key);
    uVar20 = kVar6 & uVar23;
    uVar21 = (ulong)uVar20;
    pkVar19 = h->flags;
    if ((pkVar19[uVar20 >> 4] >> ((char)uVar20 * '\x02' & 0x1fU) & 2) == 0) {
      iVar8 = 1;
      local_80 = uVar21;
      local_70 = pkVar19;
      local_58 = plVar22;
      local_48 = uVar23;
      do {
        uVar16 = pkVar19[uVar20 >> 4];
        uVar24 = uVar20 * 2 & 0x1e;
        sVar13 = (sbyte)uVar24;
        uVar9 = uVar16 >> sVar13;
        if (((uVar9 & 2) != 0) ||
           (((uVar9 & 1) == 0 &&
            (local_78 = plVar22, iVar10 = strcmp(h->keys[uVar20],(char *)key), pkVar19 = local_70,
            uVar21 = local_80, plVar22 = local_78, uVar23 = local_48, iVar10 == 0)))) {
          bVar26 = (uVar16 >> sVar13 & 2) == 0;
          uVar16 = (uint)plVar22;
          uVar23 = (uint)local_58;
          goto LAB_00133fb8;
        }
        plVar22 = (lbnode_t *)((ulong)plVar22 & 0xffffffff);
        if ((uVar16 >> uVar24 & 1) != 0) {
          plVar22 = (lbnode_t *)(ulong)uVar20;
        }
        uVar20 = uVar20 + iVar8 & uVar23;
        iVar8 = iVar8 + 1;
      } while (uVar20 != (uint)uVar21);
      bVar26 = true;
      uVar16 = (uint)local_58;
      plVar12 = local_50;
      uVar23 = uVar16;
      uVar20 = (uint)uVar21;
      if ((uint)plVar22 == uVar16) {
LAB_00133fb8:
        if (uVar16 == uVar23) {
          uVar16 = uVar20;
        }
        if (bVar26) {
          uVar16 = uVar20;
        }
        plVar22 = (lbnode_t *)(ulong)uVar16;
        plVar12 = local_50;
      }
    }
    else {
      plVar22 = (lbnode_t *)(ulong)uVar20;
    }
    uVar21 = (ulong)plVar22 >> 4;
    bVar14 = (char)plVar22 * '\x02' & 0x1e;
    if ((pkVar19[uVar21] >> bVar14 & 2) == 0) {
      if ((pkVar19[uVar21] >> bVar14 & 1) != 0) {
        h->keys[(long)plVar22] = (kh_cstr_t)key;
        h->flags[uVar21] = h->flags[uVar21] & ~(3 << bVar14);
        h->size = h->size + 1;
      }
    }
    else {
      h->keys[(long)plVar22] = (kh_cstr_t)key;
      h->flags[uVar21] = h->flags[uVar21] & ~(3 << bVar14);
      uVar2 = h->size;
      uVar3 = h->n_occupied;
      h->size = uVar2 + 1;
      h->n_occupied = uVar3 + 1;
    }
  }
  else {
    if (h->size * 2 < kVar6) {
      kVar6 = kVar6 - 1;
    }
    else {
      kVar6 = kVar6 + 1;
    }
    iVar8 = kh_resize_olap_hash(h,kVar6);
    plVar22 = (lbnode_t *)(ulong)h->n_buckets;
    if (-1 < iVar8) goto LAB_00133eb1;
  }
  iter->overlaps->vals[(long)plVar22] = plVar12;
LAB_00134041:
  plVar12 = iter->tail;
  uVar5 = iter->id;
  iter->id = uVar5 + 1;
  (plVar12->b).id = uVar5;
  iVar8 = (b->core).pos;
  plVar12->beg = iVar8;
  uVar21 = *(ulong *)&(b->core).field_0x8;
  iVar10 = bam_cigar2rlen((uint)(ushort)(uVar21 >> 0x30),
                          (uint32_t *)(b->data + (uVar21 >> 0x18 & 0xff)));
  plVar12->end = iVar10 + iVar8;
  plVar12->s = g_cstate_null;
  plVar12 = iter->tail;
  iVar8 = plVar12->end;
  (plVar12->s).end = iVar8 + -1;
  iVar10 = (b->core).tid;
  if (iVar10 < iter->max_tid) {
    __ptr = "[bam_pileup_core] the input is not sorted (chromosomes out of order)\n";
    sStack_b0 = 0x45;
  }
  else {
    iVar7 = plVar12->beg;
    if ((iVar10 != iter->max_tid) || (iter->max_pos <= iVar7)) {
      iter->max_tid = iVar10;
      iter->max_pos = iVar7;
      if ((iVar8 <= iter->pos) && ((plVar12->b).core.tid <= iter->tid)) {
        return 0;
      }
      plVar12 = mp_alloc(iter->mp);
      iter->tail->next = plVar12;
      iter->tail = plVar12;
      return 0;
    }
    __ptr = "[bam_pileup_core] the input is not sorted (reads out of order)\n";
    sStack_b0 = 0x3f;
  }
  fwrite(__ptr,sStack_b0,1,_stderr);
  iter->error = 1;
  return -1;
}

Assistant:

int bam_plp_push(bam_plp_t iter, const bam1_t *b)
{
    if (iter->error) return -1;
    if (b) {
        if (b->core.tid < 0) { overlap_remove(iter, b); return 0; }
        // Skip only unmapped reads here, any additional filtering must be done in iter->func
        if (b->core.flag & BAM_FUNMAP) { overlap_remove(iter, b); return 0; }
        if (iter->tid == b->core.tid && iter->pos == b->core.pos && iter->mp->cnt > iter->maxcnt)
        {
            overlap_remove(iter, b);
            return 0;
        }
        bam_copy1(&iter->tail->b, b);
        overlap_push(iter, iter->tail);
#ifndef BAM_NO_ID
        iter->tail->b.id = iter->id++;
#endif
        iter->tail->beg = b->core.pos;
        iter->tail->end = b->core.pos + bam_cigar2rlen(b->core.n_cigar, bam_get_cigar(b));
        iter->tail->s = g_cstate_null; iter->tail->s.end = iter->tail->end - 1; // initialize cstate_t
        if (b->core.tid < iter->max_tid) {
            fprintf(stderr, "[bam_pileup_core] the input is not sorted (chromosomes out of order)\n");
            iter->error = 1;
            return -1;
        }
        if ((b->core.tid == iter->max_tid) && (iter->tail->beg < iter->max_pos)) {
            fprintf(stderr, "[bam_pileup_core] the input is not sorted (reads out of order)\n");
            iter->error = 1;
            return -1;
        }
        iter->max_tid = b->core.tid; iter->max_pos = iter->tail->beg;
        if (iter->tail->end > iter->pos || iter->tail->b.core.tid > iter->tid) {
            iter->tail->next = mp_alloc(iter->mp);
            iter->tail = iter->tail->next;
        }
    } else iter->is_eof = 1;
    return 0;
}